

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * exprINAffinity(Parse *pParse,Expr *pExpr)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long in_RSI;
  char a;
  Expr *pA;
  int i;
  char *zRet;
  Select *pSelect;
  int nVal;
  Expr *pLeft;
  Expr *in_stack_ffffffffffffffa8;
  u64 n;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int local_34;
  
  iVar2 = sqlite3ExprVectorSize(*(Expr **)(in_RSI + 0x10));
  if ((*(uint *)(in_RSI + 4) & 0x800) == 0) {
    n = 0;
  }
  else {
    n = *(u64 *)(in_RSI + 0x20);
  }
  pcVar3 = (char *)sqlite3DbMallocRaw((sqlite3 *)
                                      CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                                      n);
  if (pcVar3 != (char *)0x0) {
    for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
      sqlite3VectorFieldSubexpr(in_stack_ffffffffffffffa8,0);
      cVar1 = sqlite3ExprAffinity(in_stack_ffffffffffffffa8);
      if (n == 0) {
        pcVar3[local_34] = cVar1;
      }
      else {
        cVar1 = sqlite3CompareAffinity(in_stack_ffffffffffffffa8,'\0');
        pcVar3[local_34] = cVar1;
      }
    }
    pcVar3[iVar2] = '\0';
  }
  return pcVar3;
}

Assistant:

static char *exprINAffinity(Parse *pParse, Expr *pExpr){
  Expr *pLeft = pExpr->pLeft;
  int nVal = sqlite3ExprVectorSize(pLeft);
  Select *pSelect = (pExpr->flags & EP_xIsSelect) ? pExpr->x.pSelect : 0;
  char *zRet;

  assert( pExpr->op==TK_IN );
  zRet = sqlite3DbMallocRaw(pParse->db, nVal+1);
  if( zRet ){
    int i;
    for(i=0; i<nVal; i++){
      Expr *pA = sqlite3VectorFieldSubexpr(pLeft, i);
      char a = sqlite3ExprAffinity(pA);
      if( pSelect ){
        zRet[i] = sqlite3CompareAffinity(pSelect->pEList->a[i].pExpr, a);
      }else{
        zRet[i] = a;
      }
    }
    zRet[nVal] = '\0';
  }
  return zRet;
}